

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_subx(DisasContext_conflict2 *s,TCGv_i32 src,TCGv_i32 dest,int opsize)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ah;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGTemp *ts;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_flush_flags(s);
  ah = tcg_const_i32_m68k(tcg_ctx,0);
  tcg_gen_add2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_X,src,ah,QREG_CC_X,ah);
  tcg_gen_sub2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_X,dest,ah,QREG_CC_N,QREG_CC_X);
  if (opsize != 2) {
    if (opsize == 1) {
      tcg_gen_ext16s_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N);
    }
    else {
      if (opsize != 0) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                   ,0x24c,(char *)0x0);
      }
      tcg_gen_ext8s_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N);
    }
  }
  tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_X,QREG_CC_X,1);
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                   (TCGArg)(QREG_CC_N + (long)tcg_ctx),(TCGArg)(dest + (long)tcg_ctx));
  ts = (TCGTemp *)(ah + (long)tcg_ctx);
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)ts,(TCGArg)(dest + (long)tcg_ctx),
                   (TCGArg)(src + (long)tcg_ctx));
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_and_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                   (TCGArg)(QREG_CC_V + (long)tcg_ctx),(TCGArg)ts);
  tcg_temp_free_internal_m68k(tcg_ctx,ts);
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                   (TCGArg)(QREG_CC_Z + (long)tcg_ctx),(TCGArg)(QREG_CC_N + (long)tcg_ctx));
  if (QREG_CC_C != QREG_CC_X) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_X + (long)tcg_ctx));
  }
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void gen_subx(DisasContext *s, TCGv src, TCGv dest, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    gen_flush_flags(s); /* compute old Z */

    /*
     * Perform substract with borrow.
     * (X, N) = dest - (src + X);
     */

    tmp = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_add2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, src, tmp, QREG_CC_X, tmp);
    tcg_gen_sub2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, dest, tmp, QREG_CC_N, QREG_CC_X);
    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_X, QREG_CC_X, 1);

    /* Compute signed-overflow for substract.  */

    tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, dest);
    tcg_gen_xor_i32(tcg_ctx, tmp, dest, src);
    tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, tmp);
    tcg_temp_free(tcg_ctx, tmp);

    /* Copy the rest of the results into place.  */
    tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N); /* !Z is sticky */
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);

    set_cc_op(s, CC_OP_FLAGS);

    /* result is in QREG_CC_N */
}